

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz-test.cpp
# Opt level: O0

void __thiscall test_encode_decode_low_power::test_method(test_encode_decode_low_power *this)

{
  size_type *packet_callback;
  initializer_list<unsigned_char> __l;
  undefined8 uVar1;
  bool bVar2;
  iterator iVar3;
  iterator iVar4;
  reference ppVar5;
  lazy_ostream *prev;
  undefined8 extraout_RDX;
  __normal_iterator<std::pair<signed_char,_signed_char>_*,_std::vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>_>
  *__rhs;
  complex<double> iq;
  basic_cstring<const_char> local_640;
  basic_cstring<const_char> local_630;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_620;
  assertion_result local_600;
  basic_cstring<const_char> local_5e8;
  basic_cstring<const_char> local_5d8;
  complex<double> local_5c8;
  pair<signed_char,_signed_char> local_5b2;
  iterator iStack_5b0;
  pair<signed_char,_signed_char> pair;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
  *__range1;
  undefined1 local_588 [8];
  vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
  complex_bytes1;
  encoder<signed_char> waver;
  undefined1 local_398 [8];
  demod_nrz zwave;
  anon_class_16_2_3216aafc wave_callback;
  bool called;
  value_type local_55 [16];
  allocator<unsigned_char> local_45;
  uchar local_44 [12];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  test_encode_decode_low_power *this_local;
  
  local_44[0] = 0xd2;
  local_44[1] = 0xd6;
  local_44[2] = 0x33;
  local_44[3] = 0x22;
  local_44[4] = 0xaa;
  local_44[5] = 0x55;
  local_44[6] = 0xd;
  local_44[7] = 0xff;
  local_44[8] = 0;
  local_44[9] = 0xff;
  local_44[10] = 0;
  local_44[0xb] = 0x9f;
  local_38 = local_44;
  local_30 = 0xc;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_char>::allocator(&local_45);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,__l,&local_45);
  std::allocator<unsigned_char>::~allocator(&local_45);
  iVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  iVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  local_55[0] = wavingz::
                checksum<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )iVar3._M_current,
                           (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )iVar4._M_current);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,local_55);
  wave_callback.buffer._7_1_ = 0;
  zwave.omega_c = (double)((long)&wave_callback.buffer + 7);
  wave_callback.called = (bool *)local_28;
  packet_callback = &waver.lp2.yv_m.m_size;
  std::function<void(unsigned_char*,unsigned_char*)>::
  function<test_encode_decode_low_power::test_method()::__0&,void>
            ((function<void(unsigned_char*,unsigned_char*)> *)packet_callback,
             (anon_class_16_2_3216aafc *)&zwave.omega_c);
  wavingz::demod::demod_nrz::demod_nrz
            ((demod_nrz *)local_398,0x1f4000,
             (function<void_(unsigned_char_*,_unsigned_char_*)> *)packet_callback);
  std::function<void_(unsigned_char_*,_unsigned_char_*)>::~function
            ((function<void_(unsigned_char_*,_unsigned_char_*)> *)&waver.lp2.yv_m.m_size);
  wavingz::encoder<signed_char>::encoder
            ((encoder<signed_char> *)
             &complex_bytes1.
              super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,2000000,40000,5.0);
  iVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  iVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  wavingz::encoder<signed_char>::operator()
            ((vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
              *)local_588,
             (encoder<signed_char> *)
             &complex_bytes1.
              super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )iVar3._M_current,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )iVar4._M_current,0.1);
  __end1 = std::
           vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
           ::begin((vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
                    *)local_588);
  iStack_5b0 = std::
               vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
               ::end((vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
                      *)local_588);
  while( true ) {
    __rhs = &stack0xfffffffffffffa50;
    bVar2 = __gnu_cxx::operator!=(&__end1,__rhs);
    if (!bVar2) break;
    ppVar5 = __gnu_cxx::
             __normal_iterator<std::pair<signed_char,_signed_char>_*,_std::vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>_>
             ::operator*(&__end1);
    local_5b2 = *ppVar5;
    std::complex<double>::complex
              (&local_5c8,(double)(int)local_5b2.first / 127.0,(double)(int)local_5b2.second / 127.0
              );
    iq._M_value._8_8_ = extraout_RDX;
    iq._M_value._0_8_ = __rhs;
    wavingz::demod::demod_nrz::operator()((demod_nrz *)local_398,iq);
    __gnu_cxx::
    __normal_iterator<std::pair<signed_char,_signed_char>_*,_std::vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>_>
    ::operator++(&__end1);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5d8,
               "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp"
               ,0x57);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_5d8,0x72,&local_5e8);
    boost::test_tools::assertion_result::assertion_result
              (&local_600,(bool)(wave_callback.buffer._7_1_ & 1));
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>(&local_630,"called",6)
    ;
    boost::unit_test::operator<<(&local_620,prev,&local_630);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_640,
               "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp"
               ,0x57);
    boost::test_tools::tt_detail::report_assertion(&local_600,&local_620,&local_640,0x72,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_620);
    boost::test_tools::assertion_result::~assertion_result(&local_600);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::
  vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
  ::~vector((vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
             *)local_588);
  wavingz::encoder<signed_char>::~encoder
            ((encoder<signed_char> *)
             &complex_bytes1.
              super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  wavingz::demod::demod_nrz::~demod_nrz((demod_nrz *)local_398);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_encode_decode_low_power)
{

    std::vector<uint8_t> buffer = { 0xd2, 0xd6, 0x33, 0x22, 0xAA, 0x55, 13, 0xFF, 0x00, 0xFF, 0x00, 0x9f };
    buffer.push_back(wavingz::checksum(buffer.begin(), buffer.end()));

    bool called = false;
    auto wave_callback = [&](uint8_t* begin, uint8_t* end)
    {
        called = true;
        BOOST_CHECK(end-begin >= 13); // we may have some more noisy bytes in the end
        BOOST_CHECK_EQUAL_COLLECTIONS(begin, begin+begin[6], buffer.begin(), buffer.end());
    };

    wavingz::demod::demod_nrz zwave(2048000, wave_callback);
    wavingz::encoder<int8_t> waver(2000000, 40000, 5);
    auto complex_bytes1 = waver(buffer.begin(), buffer.end(), 0.1);
    for(auto pair: complex_bytes1)
    {
        zwave(std::complex<double>(double(pair.first)/127.0, double(pair.second)/127.0));
    }
    BOOST_CHECK(called);
}